

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall
aim_t::EnterSectorPortal
          (aim_t *this,int position,double frac,sector_t *entersec,DAngle *newtoppitch,
          DAngle *newbottompitch)

{
  double dVar1;
  char *pcVar2;
  char *pcVar3;
  DVector2 local_168;
  aim_t local_150;
  
  dVar1 = sectorPortals.Array[entersec->Portals[position]].mPlaneZ;
  if (((position != 1) || (this->limitz <= dVar1)) && ((position != 0 || (dVar1 <= this->limitz))))
  {
    Clone(this);
    local_150.toppitch = (DAngle)newtoppitch->Degrees;
    local_150.bottompitch = (DAngle)newbottompitch->Degrees;
    local_150.aimdir = (position != 1) + 1;
    local_150.startpos.Z = (this->startpos).Z;
    local_150.startpos.X =
         (this->startpos).X + sectorPortals.Array[entersec->Portals[position]].mDisplacement.X;
    local_150.startpos.Y =
         (this->startpos).Y + sectorPortals.Array[entersec->Portals[position]].mDisplacement.Y;
    local_150.startfrac = 1.0 / this->attackrange + frac;
    local_168.X = local_150.startfrac * (this->aimtrace).X + local_150.startpos.X;
    local_168.Y = local_150.startfrac * (this->aimtrace).Y + local_150.startpos.Y;
    local_150.lastsector = P_PointInSector(&local_168);
    pcVar3 = "Alphaceiling";
    local_150.limitz = dVar1;
    if (aimdebug.Value == true) {
      pcVar2 = "Alphaceiling";
      if (position == 0) {
        pcVar2 = "Alphafloor";
      }
      Printf("-----Entering %s portal from sector %d to sector %d\n",pcVar2 + 5,
             (ulong)(uint)this->lastsector->sectornum,(ulong)(uint)(local_150.lastsector)->sectornum
            );
    }
    AimTraverse(&local_150);
    SetResult(this,&this->linetarget,&local_150.linetarget);
    SetResult(this,&this->thing_friend,&local_150.thing_friend);
    SetResult(this,&this->thing_other,&local_150.thing_other);
    if (aimdebug.Value == true) {
      if (position == 0) {
        pcVar3 = "Alphafloor";
      }
      Printf("-----Exiting %s portal\n",pcVar3 + 5);
    }
  }
  return;
}

Assistant:

void EnterSectorPortal(int position, double frac, sector_t *entersec, DAngle newtoppitch, DAngle newbottompitch)
	{
		double portalz = entersec->GetPortalPlaneZ(position);

		if (position == sector_t::ceiling && portalz < limitz) return;
		else if (position == sector_t::floor && portalz > limitz) return;
		aim_t newtrace = Clone();


		newtrace.toppitch = newtoppitch;
		newtrace.bottompitch = newbottompitch;
		newtrace.aimdir = position == sector_t::ceiling? aim_t::aim_up : aim_t::aim_down;
		newtrace.startpos = startpos + entersec->GetPortalDisplacement(position);
		newtrace.startfrac = frac + 1. / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening
		newtrace.lastsector = P_PointInSector(newtrace.startpos + aimtrace * newtrace.startfrac);
		newtrace.limitz = portalz;
		if (aimdebug)
			Printf("-----Entering %s portal from sector %d to sector %d\n", position ? "ceiling" : "floor", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
		if (aimdebug)
			Printf("-----Exiting %s portal\n", position ? "ceiling" : "floor");
	}